

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::TagAliasRegistry::add
          (TagAliasRegistry *this,string *alias,string *tag,SourceLineInfo *lineInfo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  int iVar5;
  undefined4 extraout_var;
  bool bVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_bool>
  pVar7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
  local_d8;
  ReusableStringStream local_88;
  TagAlias local_78;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_d8.first._M_dataplus._M_p = (pointer)&local_d8.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"[@","");
  _Var4._M_p = local_d8.first._M_dataplus._M_p;
  uVar2 = alias->_M_string_length;
  if ((uVar2 < local_d8.first._M_string_length) ||
     ((local_d8.first._M_string_length != 0 &&
      (iVar5 = bcmp(local_d8.first._M_dataplus._M_p,(alias->_M_dataplus)._M_p,
                    local_d8.first._M_string_length), iVar5 != 0)))) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p != &local_d8.first.field_2) {
      operator_delete(_Var4._M_p);
    }
  }
  else {
    if (uVar2 == 0) {
      bVar6 = true;
    }
    else {
      bVar6 = (alias->_M_dataplus)._M_p[uVar2 - 1] != ']';
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
      operator_delete(local_d8.first._M_dataplus._M_p);
    }
    if (!bVar6) {
      local_48 = *(undefined4 *)&lineInfo->file;
      uStack_44 = *(undefined4 *)((long)&lineInfo->file + 4);
      uStack_40 = (undefined4)lineInfo->line;
      uStack_3c = *(undefined4 *)((long)&lineInfo->line + 4);
      paVar1 = &local_78.tag.field_2;
      pcVar3 = (tag->_M_dataplus)._M_p;
      local_78.tag._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar3,pcVar3 + tag->_M_string_length);
      local_78.lineInfo.file = (char *)CONCAT44(uStack_44,local_48);
      local_78.lineInfo.line = CONCAT44(uStack_3c,uStack_40);
      clara::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
      ::pair<Catch::TagAlias,_true>(&local_d8,alias,&local_78);
      pVar7 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::TagAlias>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
                          *)&this->m_registry,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.second.tag._M_dataplus._M_p != &local_d8.second.tag.field_2) {
        operator_delete(local_d8.second.tag._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
        operator_delete(local_d8.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.tag._M_dataplus._M_p != paVar1) {
        operator_delete(local_78.tag._M_dataplus._M_p);
      }
      if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        ReusableStringStream::ReusableStringStream(&local_88);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_88.m_oss,"error: tag alias, \'",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_88.m_oss,(alias->_M_dataplus)._M_p,alias->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_88.m_oss,"\' already registered.\n",0x16);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_88.m_oss,"\tFirst seen at: ",0x10);
        iVar5 = (*(this->super_ITagAliasRegistry)._vptr_ITagAliasRegistry[2])(this,alias);
        operator<<(local_88.m_oss,(SourceLineInfo *)(CONCAT44(extraout_var,iVar5) + 0x20));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_88.m_oss,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_88.m_oss,"\tRedefined at: ",0xf);
        operator<<(local_88.m_oss,lineInfo);
        std::__cxx11::stringbuf::str();
        std::domain_error::domain_error((domain_error *)&local_78,(string *)&local_d8);
        throw_exception<std::domain_error>((domain_error *)&local_78);
      }
      return;
    }
  }
  ReusableStringStream::ReusableStringStream(&local_88);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_88.m_oss,"error: tag alias, \'",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_88.m_oss,(alias->_M_dataplus)._M_p,alias->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_88.m_oss,"\' is not of the form [@alias name].\n",0x24);
  operator<<(local_88.m_oss,lineInfo);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error((domain_error *)&local_78,(string *)&local_d8);
  throw_exception<std::domain_error>((domain_error *)&local_78);
}

Assistant:

void TagAliasRegistry::add( std::string const& alias, std::string const& tag, SourceLineInfo const& lineInfo ) {
        CATCH_ENFORCE( startsWith(alias, "[@") && endsWith(alias, ']'),
                      "error: tag alias, '" << alias << "' is not of the form [@alias name].\n" << lineInfo );

        CATCH_ENFORCE( m_registry.insert(std::make_pair(alias, TagAlias(tag, lineInfo))).second,
                      "error: tag alias, '" << alias << "' already registered.\n"
                      << "\tFirst seen at: " << find(alias)->lineInfo << "\n"
                      << "\tRedefined at: " << lineInfo );
    }